

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O3

void CTcGenTarg::multimethod_init_cb(void *ctx0,CTcSymbol *sym)

{
  textchar_t *ptVar1;
  textchar_t tVar2;
  textchar_t *sym_00;
  int iVar3;
  CTcSymbol *pCVar4;
  short *sym_01;
  CTcSymMetaclass *mc;
  size_t sVar5;
  ulong uVar6;
  uint16_t tmp;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  CTcGenTarg *pCVar11;
  ulong uVar12;
  textchar_t *ptVar13;
  short *psVar14;
  char buf [2];
  undefined6 uStack_96;
  CTcConstVal val;
  
  if (*(int *)&(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 != 1) {
    return;
  }
  sVar9 = (sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.len_;
  if (sVar9 == 0) {
    return;
  }
  sym_00 = (sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.str_;
  tVar2 = *sym_00;
  ptVar13 = sym_00;
  while (tVar2 != '*') {
    if (tVar2 < '\0') {
      return;
    }
    if ((tVar2 != '_') &&
       (iVar3 = isalpha((int)tVar2), iVar3 == 0 && (int)tVar2 - 0x3aU < 0xfffffff6)) {
      return;
    }
    sVar9 = sVar9 - 1;
    if (sVar9 == 0) {
      return;
    }
    ptVar1 = ptVar13 + 1;
    ptVar13 = ptVar13 + 1;
    tVar2 = *ptVar1;
  }
  sVar5 = 0;
  pCVar4 = CTcPrsSymtab::find(G_prs->global_symtab_,sym_00,(long)ptVar13 - (long)sym_00,
                              (CTcPrsSymtab **)0x0);
  if (pCVar4 == (CTcSymbol *)0x0) {
    return;
  }
  if (*(int *)&(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 != 1
     ) {
    return;
  }
  uVar12 = sVar9 - 1;
  if (uVar12 == 0) {
    uVar8 = 0;
  }
  else {
    psVar14 = (short *)(ptVar13 + sVar9);
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      sym_01 = (short *)((long)psVar14 + -1);
      uVar10 = uVar12 - 1;
      if (uVar10 == 0) {
        uVar12 = 0;
LAB_001e11b2:
        pCVar11 = G_cg;
        write_op(G_cg,'\b');
LAB_001e11c0:
        linker_ensure_mod_obj(pCVar11,"Object",6);
      }
      else {
        psVar14 = (short *)((long)psVar14 - uVar12);
        uVar6 = 0;
        uVar12 = uVar10;
        do {
          if (*(char *)((long)sym_01 + -1) == ';') goto LAB_001e11a4;
          sym_01 = (short *)((long)sym_01 + -1);
          uVar6 = uVar6 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        uVar12 = 0;
        uVar6 = uVar10;
        sym_01 = psVar14;
LAB_001e11a4:
        if (uVar6 == 3) {
          uVar10 = 3;
          if ((char)sym_01[1] == '.' && *sym_01 == 0x2e2e) {
            val.typ_ = TC_CVT_UNK;
            val._32_1_ = val._32_1_ & 0xfe;
            CTcConstVal::set_sstr(&val,"...",3);
            _buf = &PTR_gen_code_00314838;
            pCVar11 = (CTcGenTarg *)buf;
            CTPNConst::gen_code((CTPNConst *)pCVar11,0,0);
            goto LAB_001e11c0;
          }
        }
        else {
          uVar10 = uVar6;
          if (uVar6 == 0) goto LAB_001e11b2;
        }
        pCVar11 = (CTcGenTarg *)G_prs->global_symtab_;
        mc = (CTcSymMetaclass *)
             CTcPrsSymtab::find((CTcPrsSymtab *)pCVar11,(textchar_t *)sym_01,uVar10,
                                (CTcPrsSymtab **)0x0);
        if (mc == (CTcSymMetaclass *)0x0) {
LAB_001e145d:
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2b18,uVar6 & 0xffffffff
                             ,sym_01);
          return;
        }
        iVar3 = *(int *)&(mc->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase.
                         super_CVmHashEntryCS.super_CVmHashEntry.field_0x24;
        if (iVar3 == 9) {
          linker_ensure_mod_obj(pCVar11,mc);
        }
        else {
          if (iVar3 != 2) {
            CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2bca,
                               uVar6 & 0xffffffff,sym_01,(long)ptVar13 - (long)sym_00,sym_00);
            return;
          }
          if ((mc[1].super_CTcSymMetaclassBase.field_0x58 & 1) != 0) goto LAB_001e145d;
        }
        _buf = &PTR_gen_code_00314838;
        CTPNConst::gen_code((CTPNConst *)buf,0,0);
      }
      pCVar11 = G_cg;
      iVar3 = G_cg->sp_depth_;
      uVar8 = iVar3 + 1;
      sVar5 = (size_t)uVar8;
      G_cg->sp_depth_ = uVar8;
      if (pCVar11->max_sp_depth_ <= iVar3) {
        pCVar11->max_sp_depth_ = uVar8;
      }
      uVar8 = uVar7 + 1;
      psVar14 = sym_01;
    } while (uVar12 != 0);
    if (0xfe < uVar7) {
      write_op(G_cg,0xc1);
      buf[0] = (char)(short)uVar8;
      buf[1] = (char)((ushort)(short)uVar8 >> 8);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x2,sVar5);
      goto LAB_001e137d;
    }
  }
  write_op(G_cg,0xc0);
  buf[0] = (char)uVar8;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x1,sVar5);
LAB_001e137d:
  buf[0] = (char)G_cg->predef_meta_idx_[1];
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x1,sVar5);
  write_op(G_cg,0x8b);
  pCVar11 = G_cg;
  iVar3 = G_cg->sp_depth_ - uVar8;
  uVar8 = iVar3 + 1;
  sVar5 = (size_t)uVar8;
  G_cg->sp_depth_ = uVar8;
  if (pCVar11->max_sp_depth_ <= iVar3) {
    pCVar11->max_sp_depth_ = uVar8;
  }
  (*(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x18])
            (sym,0);
  (*(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x18])
            (pCVar4,0);
  if (*ctx0 != 0) {
    write_op(G_cg,'X');
    buf[0] = 3;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x1,sVar5);
    CTcSymFuncBase::add_abs_fixup(*ctx0,&G_cs->super_CTcDataStream);
    _buf = (undefined **)((ulong)_buf & 0xffffffff00000000);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x4,sVar5);
  }
  G_cg->sp_depth_ = G_cg->sp_depth_ + -3;
  *(int *)((long)ctx0 + 8) = *(int *)((long)ctx0 + 8) + 1;
  return;
}

Assistant:

void CTcGenTarg::multimethod_init_cb(void *ctx0, CTcSymbol *sym)
{
    mminit_ctx *ctx = (mminit_ctx *)ctx0;
    
    /* if this is a function, check to see if it's a multi-method instance */
    if (sym->get_type() == TC_SYM_FUNC)
    {
        CTcSymFunc *fsym = (CTcSymFunc *)sym;

        /* 
         *   multi-method instances have names of the form
         *   "name*type1,type2", so check the name to see if it fits the
         *   pattern 
         */
        const char *p = sym->getstr();
        size_t rem = sym->getlen();
        int is_mm = FALSE;
        for ( ; rem != 0 ; ++p, --rem)
        {
            /* 
             *   if we found a '*', it's a multimethod; otherwise, if it's
             *   anything other than a symbol character, it's not a
             *   multimethod 
             */
            if (*p == '*')
            {
                is_mm = TRUE;
                break;
            }
            else if (!is_sym(*p))
                break;
        }

        /* 
         *   If it's a multi-method symbol, build the initializer.  If it's
         *   the base function for a multi-method, build out the stub
         *   function. 
         */
        if (is_mm)
        {
            int argc;
            
            /* note the function base name - it's the part up to the '*' */
            const char *funcname = sym->getstr();
            size_t funclen = (size_t)(p - funcname);

            /* look up the base function symbol */
            CTcSymFunc *base_sym = (CTcSymFunc *)G_prs->get_global_symtab()
                                   ->find(funcname, funclen);

            /* if it's not defined as a function, ignore it */
            if (base_sym == 0 || base_sym->get_type() != TC_SYM_FUNC)
                return;

            /* 
             *   skip to the end of the string, and remove the '*' from the
             *   length count 
             */
            p += rem;
            --rem;

            /* 
             *   Run through the decorated name and look up each mentioned
             *   class.  We need to push the parameters onto the stack in
             *   reverse order to match the VM calling conventions.  
             */
            for (argc = 0 ; rem != 0 ; ++argc)
            {
                /* remember where the current name starts */
                size_t plen;

                /* skip the terminator for this item */
                --p, --rem;

                /* scan backwards to the previous delimiter */
                for (plen = 0 ; rem != 0 && *(p-1) != ';' ;
                     --p, --rem, ++plen) ;

                /* look up this name */
                if (plen == 0)
                {
                    /* 
                     *   empty name - this slot accepts any type; represent
                     *   this in the run-time formal list with 'nil' 
                     */
                    G_cg->write_op(OPC_PUSHNIL);

                    /* 
                     *   An untyped slot is implicitly an Object slot, so we
                     *   need to make sure that Object can participate in the
                     *   binding property system by ensuring that it has a
                     *   modifier object. 
                     */
                    G_cg->linker_ensure_mod_obj("Object", 6);
                }
                else if (plen == 3 && memcmp(p, "...", 3) == 0)
                {
                    /* 
                     *   varargs indicator - represent this in the list with
                     *   the literal string '...' 
                     */
                    CTcConstVal val;
                    val.set_sstr("...", 3);
                    CTPNConst cval(&val);
                    cval.gen_code(FALSE, FALSE);

                    /* 
                     *   a varargs slot is implicitly an Object slot, so make
                     *   sure Object has a modifier object
                     */
                    G_cg->linker_ensure_mod_obj("Object", 6);
                }
                else
                {
                    /* class name - look it up */
                    CTcSymbol *cl = G_prs->get_global_symtab()->find(p, plen);
                    CTcConstVal val;

                    /* 
                     *   if it's missing, unresolved, or not an object, flag
                     *   an error 
                     */
                    if (cl == 0
                        || (cl->get_type() == TC_SYM_OBJ
                            && ((CTcSymObj *)cl)->is_extern()))
                    {
                        G_tcmain->log_error(
                            0, 0, TC_SEV_ERROR, TCERR_UNDEF_SYM,
                            (int)plen, p);
                        return;
                    }
                    else if (cl->get_type() == TC_SYM_OBJ)
                    {
                        /* get the object information */
                        CTcSymObj *co = (CTcSymObj *)cl;
                        val.set_obj(co->get_obj_id(), co->get_metaclass());
                    }
                    else if (cl->get_type() == TC_SYM_METACLASS)
                    {
                        /* get the metaclass information */
                        CTcSymMetaclass *cm = (CTcSymMetaclass *)cl;
                        val.set_obj(cm->get_class_obj(), TC_META_UNKNOWN);

                        /*
                         *   If this metaclass doesn't have a modifier
                         *   object, create one for it.  This is needed
                         *   because the run-time library's multi-method
                         *   implementation stores the method binding
                         *   information in properties of the parameter
                         *   objects.  Since we're using this metaclass as a
                         *   parameter type, we'll need to write at least one
                         *   property to it.  We can only write properties to
                         *   intrinsic class objects when they're equipped
                         *   with modifier objects.
                         *   
                         *   The presence of a modifier object has no effect
                         *   at all on performance for ordinary method call
                         *   operations on the intrinsic class, and the
                         *   modifier itself is just a bare object, so the
                         *   cost of creating this extra object is trivial.  
                         */
                        G_cg->linker_ensure_mod_obj(cm);
                    }
                    else
                    {
                        /* it's not a valid object type */
                        G_tcmain->log_error(
                            0, 0, TC_SEV_ERROR, TCERR_MMPARAM_NOT_OBJECT,
                            (int)plen, p, (int)funclen, funcname);
                        return;
                    }

                    /* 
                     *   represent the object or class in the parameter list
                     *   with the object reference
                     */
                    CTPNConst cval(&val);
                    cval.gen_code(FALSE, FALSE);
                }

                /* note the value we pushed */
                G_cg->note_push();
            }

            /* build and push the list from the parameters */
            if (argc <= 255)
            {
                G_cg->write_op(OPC_NEW1);
                G_cs->write((char)argc);
            }
            else
            {
                G_cg->write_op(OPC_NEW2);
                G_cs->write2(argc);
            }
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
            G_cg->write_op(OPC_GETR0);
            G_cg->note_pop(argc);
            G_cg->note_push();

            /* push the function pointer argument */
            fsym->gen_code(FALSE);

            /* push the base function pointer argument */
            base_sym->gen_code(FALSE);

            /* 
             *   call _multiMethodRegister, if it's available (if it's not,
             *   our caller will flag this as an error, so just skip the code
             *   generation here) 
             */
            if (ctx->mmr != 0)
            {
                G_cg->write_op(OPC_CALL);
                G_cs->write(3);                           /* argument count */
                ctx->mmr->add_abs_fixup(G_cs);    /* function address fixup */
                G_cs->write4(0);                       /* fixup placeholder */
            }

            /* the 3 arguments will be gone on return */
            G_cg->note_pop(3);

            /* count the registration */
            ctx->cnt += 1;
        }
    }
}